

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

size_t __thiscall
anon_unknown.dwarf_3cc2557::filename_pos(anon_unknown_dwarf_3cc2557 *this,StringRef str,Style style)

{
  char cVar1;
  size_type sVar2;
  int iVar3;
  char *Str;
  size_t sVar4;
  StringRef local_40;
  undefined1 local_30 [8];
  StringRef str_local;
  
  str_local.Data = str.Data;
  iVar3 = (int)str.Length;
  local_30 = (undefined1  [8])this;
  if ((str_local.Data != (char *)0x0) &&
     ((cVar1 = llvm::StringRef::operator[]((StringRef *)local_30,(size_t)(str_local.Data + -1)),
      cVar1 == '/' || (cVar1 == '\\' && iVar3 == 0)))) {
    return (size_t)(str_local.Data + -1);
  }
  Str = "/";
  if (iVar3 == 0) {
    Str = "\\/";
  }
  llvm::StringRef::StringRef(&local_40,Str);
  sVar2 = llvm::StringRef::find_last_of
                    ((StringRef *)local_30,local_40,(size_t)(str_local.Data + -1));
  if ((iVar3 == 0) && (sVar2 == 0xffffffffffffffff)) {
    sVar2 = llvm::StringRef::rfind((StringRef *)local_30,':',(size_t)(str_local.Data + -2));
  }
  if (sVar2 == 0xffffffffffffffff) {
    sVar4 = 0;
  }
  else {
    if (sVar2 == 1) {
      cVar1 = llvm::StringRef::operator[]((StringRef *)local_30,0);
      if (cVar1 == '/') {
        return 0;
      }
      if (iVar3 == 0 && cVar1 == '\\') {
        return 0;
      }
    }
    sVar4 = sVar2 + 1;
  }
  return sVar4;
}

Assistant:

size_t filename_pos(StringRef str, Style style) {
    if (str.size() > 0 && is_separator(str[str.size() - 1], style))
      return str.size() - 1;

    size_t pos = str.find_last_of(separators(style), str.size() - 1);

    if (real_style(style) == Style::windows) {
      if (pos == StringRef::npos)
        pos = str.find_last_of(':', str.size() - 2);
    }

    if (pos == StringRef::npos || (pos == 1 && is_separator(str[0], style)))
      return 0;

    return pos + 1;
  }